

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlParserInputGrow(xmlParserInputPtr in,int len)

{
  long lVar1;
  size_t sVar2;
  xmlChar *pxVar3;
  size_t indx;
  int ret;
  int len_local;
  xmlParserInputPtr in_local;
  
  if ((in == (xmlParserInputPtr)0x0) || (len < 0)) {
    in_local._4_4_ = -1;
  }
  else if (in->buf == (xmlParserInputBufferPtr)0x0) {
    in_local._4_4_ = -1;
  }
  else if (in->base == (xmlChar *)0x0) {
    in_local._4_4_ = -1;
  }
  else if (in->cur == (xmlChar *)0x0) {
    in_local._4_4_ = -1;
  }
  else if (in->buf->buffer == (xmlBufPtr)0x0) {
    in_local._4_4_ = -1;
  }
  else if ((in->buf->encoder == (xmlCharEncodingHandlerPtr)0x0) &&
          (in->buf->readcallback == (xmlInputReadCallback)0x0)) {
    in_local._4_4_ = 0;
  }
  else {
    lVar1 = (long)in->cur - (long)in->base;
    sVar2 = xmlBufUse(in->buf->buffer);
    if ((int)lVar1 + 0xfa < sVar2) {
      in_local._4_4_ = 0;
    }
    else {
      in_local._4_4_ = xmlParserInputBufferGrow(in->buf,len);
      pxVar3 = xmlBufContent(in->buf->buffer);
      in->base = pxVar3;
      if (in->base == (xmlChar *)0x0) {
        in->base = "";
        in->cur = in->base;
        in->end = in->base;
        in_local._4_4_ = -1;
      }
      else {
        in->cur = in->base + lVar1;
        pxVar3 = xmlBufEnd(in->buf->buffer);
        in->end = pxVar3;
      }
    }
  }
  return in_local._4_4_;
}

Assistant:

int
xmlParserInputGrow(xmlParserInputPtr in, int len) {
    int ret;
    size_t indx;

    if ((in == NULL) || (len < 0)) return(-1);
    if (in->buf == NULL) return(-1);
    if (in->base == NULL) return(-1);
    if (in->cur == NULL) return(-1);
    if (in->buf->buffer == NULL) return(-1);

    /* Don't grow memory buffers. */
    if ((in->buf->encoder == NULL) && (in->buf->readcallback == NULL))
        return(0);

    indx = in->cur - in->base;
    if (xmlBufUse(in->buf->buffer) > (unsigned int) indx + INPUT_CHUNK) {
        return(0);
    }
    ret = xmlParserInputBufferGrow(in->buf, len);

    in->base = xmlBufContent(in->buf->buffer);
    if (in->base == NULL) {
        in->base = BAD_CAST "";
        in->cur = in->base;
        in->end = in->base;
        return(-1);
    }
    in->cur = in->base + indx;
    in->end = xmlBufEnd(in->buf->buffer);

    return(ret);
}